

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# u_init.c
# Opt level: O2

trobj * copy_trobj_list(trobj *list)

{
  void *__dest;
  trobj *ptVar1;
  ulong uVar2;
  
  for (uVar2 = 8;
      (*(short *)((long)&list[-1].trotyp + uVar2) != 0 ||
      (*(char *)((long)list + (uVar2 - 5)) != '\0')); uVar2 = uVar2 + 8) {
  }
  __dest = malloc(uVar2 & 0x7fffffff8);
  ptVar1 = (trobj *)memcpy(__dest,list,uVar2 & 0x7fffffff8);
  return ptVar1;
}

Assistant:

static struct trobj *copy_trobj_list(const struct trobj *list)
{
	struct trobj *copy;
	int len = 0;
	
	while (list[len].trotyp || list[len].trclass)
	    len++;
	len++; /* list is terminated by an entry of zeros */
	copy = malloc(len * sizeof(struct trobj));
	memcpy(copy, list, len * sizeof(struct trobj));
	
	return copy;
}